

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.cpp
# Opt level: O0

int main(void)

{
  __type _Var1;
  int iVar2;
  Iio *pIVar3;
  ostream *poVar4;
  float fVar5;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  exception *e_9;
  undefined1 local_388 [7];
  bool success_6;
  allocator<char> local_361;
  string local_360;
  exception *e_8;
  undefined1 local_330 [6];
  bool success_5;
  string attr_name_5;
  allocator<char> local_2e9;
  string local_2e8;
  exception *e_7;
  undefined1 local_2b8 [6];
  bool success_4;
  string attr_name_4;
  allocator<char> local_271;
  string local_270;
  exception *e_6;
  undefined1 local_240 [6];
  bool success_3;
  string attr_name_3;
  allocator<char> local_1f9;
  string local_1f8;
  exception *e_5;
  undefined1 local_1c8 [6];
  bool success_2;
  string attr_name_2;
  allocator<char> local_181;
  string local_180;
  exception *e_4;
  undefined1 local_150 [6];
  bool success_1;
  string attr_name_1;
  allocator<char> local_109;
  string local_108;
  exception *e_3;
  undefined1 local_d8 [6];
  bool success;
  string attr_name;
  exception *e_2;
  exception *e_1;
  Iio *iio_device1;
  exception *e;
  Iio *local_40;
  Iio *iio_device0;
  string deviceName;
  IioTestHandler testHandler;
  
  IioTestHandler::IioTestHandler((IioTestHandler *)((long)&deviceName.field_2 + 8));
  std::__cxx11::string::string((string *)&iio_device0);
  pIVar3 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar3,0);
  local_40 = pIVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"IIO device 0 found by id.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mraa::Iio::getDeviceName_abi_cxx11_((string *)&e,local_40);
  std::__cxx11::string::operator=((string *)&iio_device0,(string *)&e);
  std::__cxx11::string::~string((string *)&e);
  pIVar3 = local_40;
  if (local_40 != (Iio *)0x0) {
    mraa::Iio::~Iio(local_40);
    operator_delete(pIVar3,8);
  }
  pIVar3 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar3,1);
  if (pIVar3 != (Iio *)0x0) {
    mraa::Iio::~Iio(pIVar3);
    operator_delete(pIVar3,8);
  }
  pIVar3 = (Iio *)operator_new(8);
  mraa::Iio::Iio(pIVar3,(string *)&iio_device0);
  iio_device = pIVar3;
  poVar4 = std::operator<<((ostream *)&std::cout,"IIO device 0 found by name.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Using IIO device0. Name is ");
  mraa::Iio::getDeviceName_abi_cxx11_((string *)((long)&attr_name.field_2 + 8),iio_device);
  poVar4 = std::operator<<(poVar4,(string *)(attr_name.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(attr_name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,"in_accel_x_raw",(allocator<char> *)((long)&e_3 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
  e_3._6_1_ = 1;
  mraa::Iio::writeFloat(iio_device,(string *)local_d8,100.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"writeFloat",&local_109);
  std::__cxx11::string::string((string *)(attr_name_1.field_2._M_local_buf + 8),(string *)local_d8);
  log_result(&local_108,(string *)((long)&attr_name_1.field_2 + 8),false,(bool)(e_3._6_1_ & 1));
  std::__cxx11::string::~string((string *)(attr_name_1.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_150,"in_voltage0_scale",(allocator<char> *)((long)&e_4 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
  e_4._6_1_ = 1;
  mraa::Iio::writeFloat(iio_device,(string *)local_150,100.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"writeFloat",&local_181);
  std::__cxx11::string::string((string *)(attr_name_2.field_2._M_local_buf + 8),(string *)local_150)
  ;
  log_result(&local_180,(string *)((long)&attr_name_2.field_2 + 8),false,(bool)(e_4._6_1_ & 1));
  std::__cxx11::string::~string((string *)(attr_name_2.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"out_voltage0_raw",(allocator<char> *)((long)&e_5 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
  e_5._6_1_ = 1;
  mraa::Iio::writeInt(iio_device,(string *)local_1c8,100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"writeInt",&local_1f9);
  std::__cxx11::string::string((string *)(attr_name_3.field_2._M_local_buf + 8),(string *)local_1c8)
  ;
  log_result(&local_1f8,(string *)((long)&attr_name_3.field_2 + 8),true,(bool)(e_5._6_1_ & 1));
  std::__cxx11::string::~string((string *)(attr_name_3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_240,"in_accel_x_raw",(allocator<char> *)((long)&e_6 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_6 + 7));
  e_6._6_1_ = 0;
  iVar2 = mraa::Iio::readInt(iio_device,(string *)local_240);
  _Var1 = std::fabs<int>(iVar2 + -0x22);
  e_6._6_1_ = _Var1 < 1.1920928955078125e-07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"readInt",&local_271);
  std::__cxx11::string::string((string *)(attr_name_4.field_2._M_local_buf + 8),(string *)local_240)
  ;
  log_result(&local_270,(string *)((long)&attr_name_4.field_2 + 8),true,(bool)(e_6._6_1_ & 1));
  std::__cxx11::string::~string((string *)(attr_name_4.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)local_240);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"in_voltage0_scale",(allocator<char> *)((long)&e_7 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_7 + 7));
  e_7._6_1_ = 0;
  fVar5 = mraa::Iio::readFloat(iio_device,(string *)local_2b8);
  e_7._6_1_ = ABS(fVar5 - 0.001333) < 1.1920929e-07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"readFloat",&local_2e9);
  std::__cxx11::string::string((string *)(attr_name_5.field_2._M_local_buf + 8),(string *)local_2b8)
  ;
  log_result(&local_2e8,(string *)((long)&attr_name_5.field_2 + 8),true,(bool)(e_7._6_1_ & 1));
  std::__cxx11::string::~string((string *)(attr_name_5.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,"events/in_voltage0_thresh_rising_en",
             (allocator<char> *)((long)&e_8 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&e_8 + 7));
  e_8._6_1_ = 1;
  mraa::Iio::writeInt(iio_device,(string *)local_330,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"writeInt",&local_361);
  std::__cxx11::string::string((string *)local_388,(string *)local_330);
  log_result(&local_360,(string *)local_388,true,(bool)(e_8._6_1_ & 1));
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)local_330);
  e_9._7_1_ = 1;
  mraa::Iio::registerEventHandler(iio_device,(IioHandler *)((long)&deviceName.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"registerEventHandler(&testHandler)",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"",&local_3e1);
  log_result(&local_3b8,&local_3e0,true,(bool)(e_9._7_1_ & 1));
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  eventCount = 0;
  generate_event();
  usleep(500000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"eventReceived",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
  log_result(&local_408,&local_430,eventCount == 1,true);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  pIVar3 = iio_device;
  if (iio_device != (Iio *)0x0) {
    mraa::Iio::~Iio(iio_device);
    operator_delete(pIVar3,8);
  }
  std::__cxx11::string::~string((string *)&iio_device0);
  IioTestHandler::~IioTestHandler((IioTestHandler *)((long)&deviceName.field_2 + 8));
  return 0;
}

Assistant:

int
main(void)
{
    //! [Interesting]
    IioTestHandler testHandler;
    std::string deviceName;
    try {
        mraa::Iio* iio_device0 = new mraa::Iio(0);
        std::cout << "IIO device 0 found by id." << std::endl;
        deviceName = iio_device0->getDeviceName();
        delete iio_device0;
    } catch (std::exception& e) {
        std::cerr << "IIO device 0 not found." << std::endl;
        return EXIT_FAILURE;
    }

    try {
        mraa::Iio* iio_device1 = new mraa::Iio(1);
        delete iio_device1;
    } catch (std::exception& e) {
        std::cerr << "IIO device 1 not found. This is expected behavior." << std::endl;
    }

    try {
        iio_device = new mraa::Iio(deviceName);
        std::cout << "IIO device 0 found by name." << std::endl;
    } catch (std::exception& e) {
        std::cerr << "IIO device 0 not found." << std::endl;
        return EXIT_FAILURE;
    }

    std::cout << "Using IIO device0. Name is " << iio_device->getDeviceName() << std::endl;
    IIO_RUN(writeFloat, "in_accel_x_raw", 100, EXPECT_FAILURE);
    IIO_RUN(writeFloat, "in_voltage0_scale", 100, EXPECT_FAILURE);
    IIO_RUN(writeInt, "out_voltage0_raw", 100, EXPECT_SUCCESS);
    IIO_TEST(readInt, "in_accel_x_raw", 34, EXPECT_SUCCESS);
    IIO_TEST(readFloat, "in_voltage0_scale", 0.001333, EXPECT_SUCCESS);
    IIO_RUN(writeInt, "events/in_voltage0_thresh_rising_en", 1, EXPECT_SUCCESS);
    IIO_TRY(registerEventHandler(&testHandler));
    eventCount = 0;
    generate_event();
    usleep(500000);
    log_result("eventReceived", "", (eventCount == 1), true);
    //! [Interesting]

    delete iio_device;

    return EXIT_SUCCESS;
}